

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptArray::HasPropertyQuery
          (JavascriptArray *this,PropertyId propertyId,PropertyValueInfo *info)

{
  BOOL BVar1;
  int iVar2;
  PropertyQueryFlags PVar3;
  undefined8 uStack_28;
  uint32 index;
  
  PVar3 = Property_Found;
  if (propertyId != 0xd1) {
    uStack_28 = 1;
    BVar1 = ScriptContext::IsNumericPropertyId
                      ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                          .ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                       .ptr,propertyId,(uint32 *)((long)&uStack_28 + 4));
    if (BVar1 == 0) {
      PVar3 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
    }
    else {
      iVar2 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x24])(this,uStack_28 >> 0x20);
      PVar3 = (PropertyQueryFlags)(iVar2 == 1);
    }
  }
  return PVar3;
}

Assistant:

PropertyQueryFlags JavascriptArray::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (propertyId == PropertyIds::length)
        {
            return PropertyQueryFlags::Property_Found;
        }

        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(this->HasItem(index));
        }

        return DynamicObject::HasPropertyQuery(propertyId, info);
    }